

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::NameGenerator::BeginBlockExpr(NameGenerator *this,BlockExpr *expr)

{
  Index index;
  
  index = this->label_count_;
  this->label_count_ = index + 1;
  if ((expr->block).label._M_string_length == 0) {
    GenerateName("$B",index,0,&(expr->block).label);
  }
  return (Result)Ok;
}

Assistant:

Result NameGenerator::BeginBlockExpr(BlockExpr* expr) {
  MaybeGenerateName("$B", label_count_++, &expr->block.label);
  return Result::Ok;
}